

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.h
# Opt level: O0

void __thiscall RenX::BanDatabase::BanDatabase(BanDatabase *this)

{
  BanDatabase *this_local;
  
  Jupiter::Database::Database(&this->super_Database);
  *(undefined ***)this = &PTR_process_data_001f9228;
  this->m_write_version = '\x05';
  this->m_read_version = this->m_write_version;
  std::__cxx11::string::string((string *)&this->m_filename);
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  ::vector(&this->m_entries);
  return;
}

Assistant:

class RENX_API BanDatabase : public Jupiter::Database
	{
	public: // Jupiter::Database
		/**
		* @brief Processes a chunk of data in a database.
		*
		* @param buffer Buffer to process
		* @param file File being processed
		* @param pos position that the buffer starts at in the file
		*/
		void process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos) override;

		/**
		* @brief Processes the header for a database.
		*
		* @param file File being processed
		*/
		void process_header(FILE *file) override;

		/**
		* @brief Generates a header for a database.
		*
		* @param file File being created
		*/
		void create_header(FILE *file) override;

		/**
		* @brief Called when process_file() is successfully completed.
		*
		* @param file File being processed
		*/
		void process_file_finish(FILE *file) override;

	public:
		/**
		* @brief Represents a Ban entry in the database.
		*/
		struct RENX_API Entry
		{
			using VarDataTableType = std::unordered_map<std::string, std::string, jessilib::text_hash, jessilib::text_equal>;

			fpos_t pos; /** Position of the entry in the database */
			uint16_t flags /** Flags affecting this ban entry (See below for flags) */ = 0x00;
			std::chrono::system_clock::time_point timestamp /** Time the ban was created */;
			std::chrono::seconds length /** Duration of the ban; 0 if permanent */;
			uint64_t steamid /** SteamID of the banned player */;
			uint32_t ip /** IPv4 address of the banned player */;
			uint8_t prefix_length /** Prefix length for the IPv4 address block */;
			std::string hwid; /** Hardware ID of the banned player */
			std::string rdns /** RDNS of the banned player */;
			std::string name /** Name of the banned player */;
			std::string banner /** Name of the user who initiated the ban */;
			std::string reason /** Reason the player was banned */;
			VarDataTableType varData; /** Variable entry data */

			static const uint16_t FLAG_ACTIVE = 0x8000U;
			static const uint16_t FLAG_USE_RDNS = 0x4000U;
			static const uint16_t FLAG_TYPE_GAME = 0x0080U;
			static const uint16_t FLAG_TYPE_CHAT = 0x0040U;
			static const uint16_t FLAG_TYPE_BOT = 0x0020U;
			static const uint16_t FLAG_TYPE_VOTE = 0x0010U;
			static const uint16_t FLAG_TYPE_MINE = 0x0008U;
			static const uint16_t FLAG_TYPE_LADDER = 0x0004U;
			static const uint16_t FLAG_TYPE_ALERT = 0x0002U;

			inline bool is_active() { return (flags & FLAG_ACTIVE) != 0; };
			inline bool is_rdns_ban() { return (flags & FLAG_USE_RDNS) != 0; };
			inline bool is_type_game() { return (flags & FLAG_TYPE_GAME) != 0; };
			inline bool is_type_chat() { return (flags & FLAG_TYPE_CHAT) != 0; };
			inline bool is_type_bot() { return (flags & FLAG_TYPE_BOT) != 0; };
			inline bool is_type_vote() { return (flags & FLAG_TYPE_VOTE) != 0; };
			inline bool is_type_mine() { return (flags & FLAG_TYPE_MINE) != 0; };
			inline bool is_type_ladder() { return (flags & FLAG_TYPE_LADDER) != 0; };
			inline bool is_type_alert() { return (flags & FLAG_TYPE_ALERT) != 0; };

			inline void set_active() { flags |= FLAG_ACTIVE; };
			inline void set_rdns_ban() { flags |= FLAG_USE_RDNS; }
			inline void set_type_game() { flags |= FLAG_TYPE_GAME; };
			inline void set_type_chat() { flags |= FLAG_TYPE_CHAT; };
			inline void set_type_bot() { flags |= FLAG_TYPE_BOT; };
			inline void set_type_vote() { flags |= FLAG_TYPE_VOTE; };
			inline void set_type_mine() { flags |= FLAG_TYPE_MINE; };
			inline void set_type_ladder() { flags |= FLAG_TYPE_LADDER; };
			inline void set_type_alert() { flags |= FLAG_TYPE_ALERT; };
			inline void set_type_global() { flags = 0xFFFFU; };

			inline void unset_active() { flags &= ~FLAG_ACTIVE; };
			inline void unset_rdns_ban() { flags &= ~FLAG_USE_RDNS; }
			inline void unset_type_game() { flags &= ~FLAG_TYPE_GAME; };
			inline void unset_type_chat() { flags &= ~FLAG_TYPE_CHAT; };
			inline void unset_type_bot() { flags &= ~FLAG_TYPE_BOT; };
			inline void unset_type_vote() { flags &= ~FLAG_TYPE_VOTE; };
			inline void unset_type_mine() { flags &= ~FLAG_TYPE_MINE; };
			inline void unset_type_ladder() { flags &= ~FLAG_TYPE_LADDER; };
			inline void unset_type_alert() { flags &= ~FLAG_TYPE_ALERT; };
			inline void unset_type_global() { flags = 0x0000U; };
		}